

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void mulmod256(uint16_t *out,uint16_t *a,uint16_t *b,uint16_t *m)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  ushort *puVar12;
  long lVar13;
  long lVar14;
  uint16_t mul [32];
  uint16_t mul2 [32];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (b == (uint16_t *)0x0) {
    local_98 = *(undefined8 *)(a + 8);
    uStack_90 = *(undefined8 *)(a + 0xc);
    local_a8 = *(undefined8 *)a;
    uStack_a0 = *(undefined8 *)(a + 4);
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    for (uVar1 = 0xff; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
      if ((*(ushort *)((long)&local_a8 + (ulong)(uVar1 >> 4) * 2) >> (uVar1 & 0xf) & 1) != 0)
      goto LAB_00132487;
    }
  }
  else {
    uVar8 = 0;
    for (uVar3 = 0; uVar3 != 0x20; uVar3 = uVar3 + 1) {
      lVar11 = 0;
      if (0xf < uVar3) {
        lVar11 = (long)((int)uVar3 + -0xf);
      }
      puVar12 = b + -lVar11;
      for (; (lVar11 <= (long)uVar3 && (lVar11 < 0x10)); lVar11 = lVar11 + 1) {
        uVar8 = uVar8 + (ulong)*puVar12 * (ulong)a[lVar11];
        puVar12 = puVar12 + -1;
      }
      *(short *)((long)&local_a8 + uVar3 * 2) = (short)uVar8;
      uVar8 = uVar8 >> 0x10;
      b = b + 1;
    }
    if (uVar8 != 0) {
      pcVar9 = "test condition failed: c == 0";
      uVar4 = 0x2ff;
      goto LAB_0013259f;
    }
    for (uVar1 = 0x1ff; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
      if ((*(ushort *)((long)&local_a8 + (ulong)(uVar1 >> 4) * 2) >> (uVar1 & 0xf) & 1) != 0)
      goto LAB_00132487;
    }
  }
  uVar1 = 0;
LAB_00132487:
  if (m == (uint16_t *)0x0) {
LAB_001325ab:
    *(undefined8 *)(out + 8) = local_98;
    *(undefined8 *)(out + 0xc) = uStack_90;
    *(undefined8 *)out = local_a8;
    *(undefined8 *)(out + 4) = uStack_a0;
    return;
  }
  for (uVar5 = 0xff; -1 < (int)uVar5; uVar5 = uVar5 - 1) {
    if ((m[uVar5 >> 4] >> (uVar5 & 0xf) & 1) != 0) goto LAB_001324b5;
  }
  uVar5 = 0;
LAB_001324b5:
  iVar7 = uVar5 - uVar1;
  for (lVar11 = (long)(int)(uVar1 - uVar5); -1 < lVar11; lVar11 = lVar11 + -1) {
    lVar13 = 0;
    iVar10 = iVar7;
    for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 1) {
      uVar1 = 0;
      for (iVar2 = 0; iVar2 != 0x10; iVar2 = iVar2 + 1) {
        uVar6 = iVar10 + iVar2;
        if (uVar6 < 0x100) {
          uVar1 = uVar1 | (uint)((m[uVar6 >> 4] >> (uVar6 & 0xf) & 1) != 0) << ((byte)iVar2 & 0x1f);
        }
      }
      lVar13 = (lVar13 - (ulong)(uVar1 & 0xffff)) + (ulong)*(ushort *)((long)&local_a8 + lVar14 * 2)
      ;
      *(short *)((long)&local_68 + lVar14 * 2) = (short)lVar13;
      lVar13 = lVar13 >> 0x10;
      iVar10 = iVar10 + 0x10;
    }
    if (lVar13 == 0) {
      local_78 = local_38;
      uStack_70 = uStack_30;
      local_88 = local_48;
      uStack_80 = uStack_40;
      local_98 = local_58;
      uStack_90 = uStack_50;
      local_a8 = local_68;
      uStack_a0 = uStack_60;
    }
    iVar7 = iVar7 + 1;
  }
  uVar3 = (ulong)(uVar5 >> 4);
  do {
    if (0x1e < uVar3) goto LAB_001325ab;
    lVar11 = uVar3 * 2;
    uVar3 = uVar3 + 1;
  } while (*(short *)((long)&local_a8 + lVar11 + 2) == 0);
  pcVar9 = "test condition failed: mul[i] == 0";
  uVar4 = 0x33c;
LAB_0013259f:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
          ,uVar4,pcVar9);
  abort();
}

Assistant:

static void mulmod256(uint16_t* out, const uint16_t* a, const uint16_t* b, const uint16_t* m) {
    uint16_t mul[32];
    uint64_t c = 0;
    int i, j;
    int m_bitlen = 0;
    int mul_bitlen = 0;

    if (b != NULL) {
        /* Compute the product of a and b, and put it in mul. */
        for (i = 0; i < 32; ++i) {
            for (j = i <= 15 ? 0 : i - 15; j <= i && j <= 15; j++) {
                c += (uint64_t)a[j] * b[i - j];
            }
            mul[i] = c & 0xFFFF;
            c >>= 16;
        }
        CHECK(c == 0);

        /* compute the highest set bit in mul */
        for (i = 511; i >= 0; --i) {
            if ((mul[i >> 4] >> (i & 15)) & 1) {
                mul_bitlen = i;
                break;
            }
        }
    } else {
        /* if b==NULL, set mul=a. */
        memcpy(mul, a, 32);
        memset(mul + 16, 0, 32);
        /* compute the highest set bit in mul */
        for (i = 255; i >= 0; --i) {
            if ((mul[i >> 4] >> (i & 15)) & 1) {
                mul_bitlen = i;
                break;
            }
        }
    }

    if (m) {
        /* Compute the highest set bit in m. */
        for (i = 255; i >= 0; --i) {
            if ((m[i >> 4] >> (i & 15)) & 1) {
                m_bitlen = i;
                break;
            }
        }

        /* Try do mul -= m<<i, for i going down to 0, whenever the result is not negative */
        for (i = mul_bitlen - m_bitlen; i >= 0; --i) {
            uint16_t mul2[32];
            int64_t cs;

            /* Compute mul2 = mul - m<<i. */
            cs = 0; /* accumulator */
            for (j = 0; j < 32; ++j) { /* j loops over the output limbs in mul2. */
                /* Compute sub: the 16 bits in m that will be subtracted from mul2[j]. */
                uint16_t sub = 0;
                int p;
                for (p = 0; p < 16; ++p) { /* p loops over the bit positions in mul2[j]. */
                    int bitpos = j * 16 - i + p; /* bitpos is the correspond bit position in m. */
                    if (bitpos >= 0 && bitpos < 256) {
                        sub |= ((m[bitpos >> 4] >> (bitpos & 15)) & 1) << p;
                    }
                }
                /* Add mul[j]-sub to accumulator, and shift bottom 16 bits out to mul2[j]. */
                cs += mul[j];
                cs -= sub;
                mul2[j] = (cs & 0xFFFF);
                cs >>= 16;
            }
            /* If remainder of subtraction is 0, set mul = mul2. */
            if (cs == 0) {
                memcpy(mul, mul2, sizeof(mul));
            }
        }
        /* Sanity check: test that all limbs higher than m's highest are zero */
        for (i = (m_bitlen >> 4) + 1; i < 32; ++i) {
            CHECK(mul[i] == 0);
        }
    }
    memcpy(out, mul, 32);
}